

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::WordTagger::SerializeWithCachedSizes
          (WordTagger *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  string *psVar6;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  WordTagger *this_local;
  
  uVar2 = revision(this);
  if (uVar2 != 0) {
    uVar2 = revision(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,uVar2,output);
  }
  language_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    language_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    language_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,"CoreML.Specification.CoreMLModels.WordTagger.language");
    psVar6 = language_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(10,psVar6,output);
  }
  tokensoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    tokensoutputfeaturename_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    tokensoutputfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,
               "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName");
    psVar6 = tokensoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x14,psVar6,output);
  }
  tokentagsoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    tokentagsoutputfeaturename_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    tokentagsoutputfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,
               "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName");
    psVar6 = tokentagsoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x15,psVar6,output);
  }
  tokenlocationsoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    tokenlocationsoutputfeaturename_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    tokenlocationsoutputfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,
               "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName");
    psVar6 = tokenlocationsoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x16,psVar6,output);
  }
  tokenlengthsoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    tokenlengthsoutputfeaturename_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    tokenlengthsoutputfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,
               "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName");
    psVar6 = tokenlengthsoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x17,psVar6,output);
  }
  modelparameterdata_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar6 = modelparameterdata_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(100,psVar6,output);
  }
  bVar1 = has_stringtags(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (200,&((this->Tags_).stringtags_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void WordTagger::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.WordTagger)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 revision = 1;
  if (this->revision() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->revision(), output);
  }

  // string language = 10;
  if (this->language().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->language().data(), this->language().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordTagger.language");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->language(), output);
  }

  // string tokensOutputFeatureName = 20;
  if (this->tokensoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->tokensoutputfeaturename().data(), this->tokensoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      20, this->tokensoutputfeaturename(), output);
  }

  // string tokenTagsOutputFeatureName = 21;
  if (this->tokentagsoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->tokentagsoutputfeaturename().data(), this->tokentagsoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      21, this->tokentagsoutputfeaturename(), output);
  }

  // string tokenLocationsOutputFeatureName = 22;
  if (this->tokenlocationsoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->tokenlocationsoutputfeaturename().data(), this->tokenlocationsoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      22, this->tokenlocationsoutputfeaturename(), output);
  }

  // string tokenLengthsOutputFeatureName = 23;
  if (this->tokenlengthsoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->tokenlengthsoutputfeaturename().data(), this->tokenlengthsoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      23, this->tokenlengthsoutputfeaturename(), output);
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      100, this->modelparameterdata(), output);
  }

  // .CoreML.Specification.StringVector stringTags = 200;
  if (has_stringtags()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      200, *Tags_.stringtags_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.WordTagger)
}